

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeTriang>::ComputeSolutionHCurlT<double>
          (TPZCompElHCurl<pzshape::TPZShapeTriang> *this,TPZFMatrix<double> *phiHCurl,
          TPZFMatrix<double> *curlPhi,TPZSolVec<double> *sol,TPZSolVec<double> *curlSol)

{
  double dVar1;
  long lVar2;
  TPZManVector<double,_10> *pTVar3;
  TNode *pTVar4;
  double *pdVar5;
  TPZSolVec<double> *pTVar6;
  int iVar7;
  long *plVar8;
  TPZCompMesh *pTVar9;
  TPZFMatrix<double> *pTVar10;
  long lVar11;
  long lVar12;
  int coord;
  long lVar13;
  int iVar14;
  long lVar15;
  double extraout_XMM0_Qa;
  long local_90;
  double local_78;
  int local_6c;
  TPZCompElHCurl<pzshape::TPZShapeTriang> *local_68;
  TPZSolVec<double> *local_60;
  long local_58;
  TPZCompMesh *local_50;
  long local_48;
  long local_40;
  TPZFMatrix<double> *local_38;
  
  local_38 = curlPhi;
  plVar8 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0xb8))();
  (**(code **)(*plVar8 + 0x78))(plVar8);
  iVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  local_68 = this;
  pTVar9 = TPZCompEl::Mesh((TPZCompEl *)this);
  pTVar10 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar9->fSolution);
  lVar2 = (pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (*(sol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(sol,lVar2);
  local_60 = curlSol;
  (*(curlSol->super_TPZVec<TPZManVector<double,_10>_>)._vptr_TPZVec[3])(curlSol,lVar2);
  if (0 < lVar2) {
    lVar15 = 0;
    lVar11 = lVar2;
    do {
      pTVar3 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar15 + -0x20) + 0x18))
                ((long)pTVar3->fExtAlloc + lVar15 + -0x20,2);
      local_78 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((sol->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                 lVar15 + -0x20),&local_78,0,-1);
      pTVar6 = local_60;
      pTVar3 = (local_60->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (**(code **)(*(long *)((long)pTVar3->fExtAlloc + lVar15 + -0x20) + 0x18))
                ((long)pTVar3->fExtAlloc + lVar15 + -0x20,1);
      local_78 = 0.0;
      TPZVec<double>::Fill
                ((TPZVec<double> *)
                 ((long)((pTVar6->super_TPZVec<TPZManVector<double,_10>_>).fStore)->fExtAlloc +
                 lVar15 + -0x20),&local_78,0,-1);
      lVar15 = lVar15 + 0x70;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  local_50 = TPZCompEl::Mesh((TPZCompEl *)local_68);
  if (0 < iVar7) {
    lVar11 = 0;
    iVar14 = 0;
    do {
      lVar15 = (**(code **)(*(long *)&(local_68->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                      super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                      super_TPZCompEl + 0xa8))(local_68,iVar14);
      pTVar4 = (local_50->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      local_40 = (long)pTVar4[*(int *)(lVar15 + 8)].dim;
      if (0 < local_40) {
        local_48 = (long)pTVar4[*(int *)(lVar15 + 8)].pos;
        lVar11 = (long)(int)lVar11;
        local_90 = 0;
        local_6c = iVar14;
        do {
          if (0 < lVar2) {
            lVar15 = local_90 + local_48;
            lVar12 = 0;
            do {
              local_58 = lVar12 * 0x70;
              lVar13 = 0;
              do {
                if (((lVar15 < 0) ||
                    ((pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar15)) ||
                   ((pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((lVar11 < 0) ||
                    ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar11)) ||
                   ((phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar13)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x278);
                }
                pdVar5 = (sol->super_TPZVec<TPZManVector<double,_10>_>).fStore[lVar12].
                         super_TPZVec<double>.fStore;
                pdVar5[lVar13] =
                     pTVar10->fElem
                     [(pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar12 + lVar15]
                     * phiHCurl->fElem
                       [(phiHCurl->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar13 +
                        lVar11] + pdVar5[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 == 1);
              if (((lVar15 < 0) ||
                  ((pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar15)) ||
                 ((pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              dVar1 = pTVar10->fElem
                      [(pTVar10->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar12 + lVar15
                      ];
              (*(local_38->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x21])(local_38,0,lVar11);
              pdVar5 = *(double **)
                        ((long)((local_60->super_TPZVec<TPZManVector<double,_10>_>).fStore)->
                               fExtAlloc + local_58 + -0x18);
              *pdVar5 = extraout_XMM0_Qa * dVar1 + *pdVar5;
              lVar12 = lVar12 + 1;
            } while (lVar12 != lVar2);
          }
          lVar11 = lVar11 + 1;
          local_90 = local_90 + 1;
          iVar14 = local_6c;
        } while (local_90 != local_40);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 != iVar7);
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::ComputeSolutionHCurlT(
  const TPZFMatrix<REAL> &phiHCurl, const TPZFMatrix<REAL> &curlPhi,
    TPZSolVec<TVar> &sol, TPZSolVec<TVar> &curlSol)
{
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curlDim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nVar = this->Material()->NStateVariables();
    const int nConnects = this->NConnects();

    TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();

    long numberSol = meshSol.Cols();
#ifdef PZDEBUG
    if (numberSol != 1 || nVar != 1) {
        DebugStop();
    }
#endif

    sol.Resize(numberSol);
    curlSol.Resize(numberSol);

    for (long iSol = 0; iSol < numberSol; iSol++) {
        sol[iSol].Resize(dim);
        sol[iSol].Fill(0);
        curlSol[iSol].Resize(curlDim);
        curlSol[iSol].Fill(0);
    }

    TPZBlock &block = this->Mesh()->Block();
    int ishape = 0;
    for (int iCon = 0; iCon < nConnects; iCon++) {
        TPZConnect *con = &this->Connect(iCon);
        const auto conSeqN = con->SequenceNumber();
        const auto nShapeCon = block.Size(conSeqN);
        const auto pos = block.Position(conSeqN);

        for (int jShape = 0; jShape < nShapeCon; jShape++) {

            for (long iSol = 0; iSol < numberSol; iSol++) {
                for (int coord = 0; coord < dim; coord++) {
                    sol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * phiHCurl(ishape, coord);
                }
                for (int coord = 0; coord < curlDim; coord++) {
                    curlSol[iSol][coord] +=
                            (TVar)meshSol(pos + jShape, iSol) * curlPhi.Get(coord, ishape);
                }
            }
            ishape++;
        }
    }
}